

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::closure(Automaton *this,StatePointer state)

{
  long lVar1;
  bool bVar2;
  pointer pSVar3;
  Automaton *aut;
  _List_iterator<Item> *p_Var4;
  reference p_Var5;
  _List_iterator<Rule> *p_Var6;
  _Bucket *in_RDI;
  long in_FS_OFFSET;
  pair<std::_List_iterator<Item>,_bool> pVar7;
  pair<std::_List_iterator<State>,_bool> pVar8;
  RulePointer *rule;
  StatePointer target;
  iterator bucket;
  QList<std::_List_iterator<State>_> todo;
  Item ii;
  const_iterator it;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  range;
  ItemPointer item_1;
  ItemPointer item;
  QStack<std::_List_iterator<Item>_> working_list;
  bucket_map_type buckets;
  pair<std::_List_iterator<State>,_bool> r_1;
  pair<std::_List_iterator<Item>,_bool> r;
  ItemPointer in_stack_fffffffffffffe48;
  Grammar *in_stack_fffffffffffffe50;
  _List_iterator<QString> *key;
  _List_iterator<QString> *in_stack_fffffffffffffe60;
  Name in_stack_fffffffffffffe68;
  State *in_stack_fffffffffffffe70;
  _List_iterator<Item> in_stack_fffffffffffffe98;
  _List_iterator<QString> local_138 [10];
  iterator local_e8;
  iterator local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  _List_node_base *local_c0;
  undefined1 local_b8;
  _List_node_base *local_b0;
  _List_iterator<QString> local_a8;
  _List_node_base *p_Stack_a0;
  const_iterator local_90;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  local_88;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _Self local_60;
  _Self local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  StatePointer state_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f050);
  bVar2 = std::__cxx11::list<Item,_std::allocator<Item>_>::empty(&pSVar3->closure);
  if (bVar2) {
    state_00._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    QMap<std::_List_iterator<QString>,__Bucket>::QMap
              ((QMap<std::_List_iterator<QString>,__Bucket> *)0x11f081);
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QStack<std::_List_iterator<Item>_>::QStack((QStack<std::_List_iterator<Item>_> *)0x11f0bb);
    local_58._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f0d7);
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffe50);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f0f4);
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffe50);
      bVar2 = std::operator!=(&local_58,&local_60);
      if (!bVar2) break;
      QStack<std::_List_iterator<Item>_>::push
                ((QStack<std::_List_iterator<Item>_> *)in_stack_fffffffffffffe50,
                 (_List_iterator<Item> *)in_stack_fffffffffffffe48._M_node);
      std::_List_iterator<Item>::operator++(&local_58);
    }
    aut = (Automaton *)std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f150);
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f162);
    std::__cxx11::list<Item,_std::allocator<Item>_>::operator=
              (&in_stack_fffffffffffffe70->kernel,
               (list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffe68._M_node);
    while (bVar2 = QList<std::_List_iterator<Item>_>::empty
                             ((QList<std::_List_iterator<Item>_> *)0x11f180),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      local_68 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
      p_Var4 = QStack<std::_List_iterator<Item>_>::top
                         ((QStack<std::_List_iterator<Item>_> *)0x11f1a7);
      local_68 = p_Var4->_M_node;
      in_stack_fffffffffffffe98 =
           QStack<std::_List_iterator<Item>_>::pop(in_stack_fffffffffffffe48._M_node);
      std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x11f1d1);
      bVar2 = Item::isReduceItem((Item *)in_stack_fffffffffffffe50);
      if (!bVar2) {
        std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x11f1ee);
        std::_List_iterator<std::_List_iterator<QString>_>::operator*
                  ((_List_iterator<std::_List_iterator<QString>_> *)0x11f1fa);
        QMap<std::_List_iterator<QString>,__Bucket>::operator[]
                  ((QMap<std::_List_iterator<QString>,__Bucket> *)aut,
                   (_List_iterator<QString> *)in_stack_fffffffffffffe70);
        local_70 = local_68;
        _Bucket::insert((_Bucket *)0x11f22a,in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe70 =
             (State *)(in_RDI->items).
                      super__List_base<std::_List_iterator<Item>,_std::allocator<std::_List_iterator<Item>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
        std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x11f244);
        p_Var5 = std::_List_iterator<std::_List_iterator<QString>_>::operator*
                           ((_List_iterator<std::_List_iterator<QString>_> *)0x11f250);
        local_78 = p_Var5->_M_node;
        bVar2 = Grammar::isNonTerminal(in_stack_fffffffffffffe50,in_stack_fffffffffffffe68);
        if (bVar2) {
          local_88.second.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
          local_88.first.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffe68._M_node =
               (in_RDI->items).
               super__List_base<std::_List_iterator<Item>,_std::allocator<std::_List_iterator<Item>_>_>
               ._M_impl._M_node.super__List_node_base._M_next + 0x11 + 8;
          std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x11f2b4);
          std::_List_iterator<std::_List_iterator<QString>_>::operator*
                    ((_List_iterator<std::_List_iterator<QString>_> *)0x11f2c0);
          local_88 = QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::
                     equal_range((QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>
                                  *)in_stack_fffffffffffffe68._M_node,in_stack_fffffffffffffe60);
          local_90 = local_88.first.i._M_node;
          while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffe50,
                                      (const_iterator *)in_stack_fffffffffffffe48._M_node), bVar2) {
            p_Var6 = QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::
                     const_iterator::operator*((const_iterator *)0x11f33a);
            local_a8._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
            p_Stack_a0 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffe60 = &local_a8;
            Item::Item((Item *)in_stack_fffffffffffffe50);
            local_a8._M_node = p_Var6->_M_node;
            std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11f37a);
            local_b0 = (_List_node_base *)
                       std::__cxx11::
                       list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                       ::begin((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                                *)in_stack_fffffffffffffe50);
            p_Stack_a0 = local_b0;
            std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f3ba);
            pVar7 = State::insertClosure((State *)aut,(Item *)in_stack_fffffffffffffe70);
            local_c0 = (_List_node_base *)pVar7.first._M_node;
            local_b8 = pVar7.second;
            if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              QStack<std::_List_iterator<Item>_>::push
                        ((QStack<std::_List_iterator<Item>_> *)in_stack_fffffffffffffe50,
                         (_List_iterator<Item> *)in_stack_fffffffffffffe48._M_node);
            }
            QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator::
            operator++((const_iterator *)in_stack_fffffffffffffe50);
          }
        }
      }
    }
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_d0 = 0xaaaaaaaaaaaaaaaa;
    local_c8 = 0xaaaaaaaaaaaaaaaa;
    QList<std::_List_iterator<State>_>::QList((QList<std::_List_iterator<State>_> *)0x11f468);
    local_e0._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_e0._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,__Bucket>::begin
                   ((QMap<std::_List_iterator<QString>,__Bucket> *)in_stack_fffffffffffffe60);
    while( true ) {
      local_e8._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,__Bucket>::end
                     ((QMap<std::_List_iterator<QString>,__Bucket> *)in_stack_fffffffffffffe60);
      bVar2 = ::operator!=((iterator *)in_stack_fffffffffffffe50,
                           (iterator *)in_stack_fffffffffffffe48._M_node);
      if (!bVar2) break;
      QMap<std::_List_iterator<QString>,__Bucket>::iterator::operator->((iterator *)0x11f4db);
      key = local_138;
      _Bucket::toState(in_RDI,aut);
      pVar8 = internState(aut,in_stack_fffffffffffffe70);
      State::~State((State *)in_stack_fffffffffffffe50);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        QList<std::_List_iterator<State>_>::push_back
                  ((QList<std::_List_iterator<State>_> *)in_stack_fffffffffffffe50,
                   (parameter_type)in_stack_fffffffffffffe48._M_node);
      }
      pSVar3 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x11f574);
      in_stack_fffffffffffffe50 = (Grammar *)&pSVar3->bundle;
      QMap<std::_List_iterator<QString>,__Bucket>::iterator::key((iterator *)0x11f58a);
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::insert
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                 in_stack_fffffffffffffe60,key,(_List_iterator<State> *)in_stack_fffffffffffffe50);
      QMap<std::_List_iterator<QString>,__Bucket>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffe50);
    }
    while (bVar2 = QList<std::_List_iterator<State>_>::empty
                             ((QList<std::_List_iterator<State>_> *)0x11f5c2),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      QList<std::_List_iterator<State>_>::front((QList<std::_List_iterator<State>_> *)0x11f5d7);
      closure((Automaton *)in_stack_fffffffffffffe98._M_node,state_00);
      QList<std::_List_iterator<State>_>::pop_front((QList<std::_List_iterator<State>_> *)0x11f5fb);
    }
    QList<std::_List_iterator<State>_>::~QList((QList<std::_List_iterator<State>_> *)0x11f60a);
    QStack<std::_List_iterator<Item>_>::~QStack((QStack<std::_List_iterator<Item>_> *)0x11f617);
    QMap<std::_List_iterator<QString>,__Bucket>::~QMap
              ((QMap<std::_List_iterator<QString>,__Bucket> *)0x11f624);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::closure (StatePointer state)
{
  if (! state->closure.empty ()) // ### not true.
    return;

  typedef QMap<Name, _Bucket> bucket_map_type;

  bucket_map_type buckets;
  QStack<ItemPointer> working_list;

  for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
    working_list.push (item);

  state->closure = state->kernel;

  while (! working_list.empty ())
    {
      ItemPointer item = working_list.top ();
      working_list.pop ();

      if (item->isReduceItem ())
        continue;

      buckets [*item->dot].insert (item);

      if (_M_grammar->isNonTerminal (*item->dot))
        {
          const auto range = std::as_const(_M_grammar->rule_map).equal_range(*item->dot);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              Item ii;
              ii.rule = rule;
              ii.dot = rule->rhs.begin ();

              std::pair<ItemPointer, bool> r = state->insertClosure(ii);

              if (r.second)
                working_list.push (r.first);
            }
        }
    }

  QList<StatePointer> todo;

  for (bucket_map_type::iterator bucket = buckets.begin (); bucket != buckets.end (); ++bucket)
    {
      std::pair<StatePointer, bool> r = internState(bucket->toState(this));

      StatePointer target = r.first;

      if (r.second)
        todo.push_back (target);

      state->bundle.insert (bucket.key(), target);
    }

  while (! todo.empty ())
    {
      closure (todo.front ());
      todo.pop_front ();
    }
}